

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetra-codec-impl.c
# Opt level: O0

void Syn_Filt(tetra_codec *st,Word16 *a,Word16 *x,Word16 *y,Word16 lg,Word16 *mem,Word16 update)

{
  Word16 WVar1;
  Word32 L_var1;
  long in_RCX;
  short in_R8W;
  long in_R9;
  Word16 *yy;
  Word16 tmp [80];
  Word32 s;
  Word16 j;
  Word16 i;
  undefined2 auStackY_100c4 [32750];
  Word16 in_stack_ffffffffffffff18;
  Word16 in_stack_ffffffffffffff1a;
  Word32 in_stack_ffffffffffffff1c;
  tetra_codec *st_00;
  Word32 local_38;
  short local_34;
  short local_32;
  long local_30;
  short local_22;
  long local_20;
  
  st_00 = (tetra_codec *)&stack0xffffffffffffff28;
  local_30 = in_R9;
  local_22 = in_R8W;
  local_20 = in_RCX;
  for (local_32 = 0; local_32 < 10; local_32 = local_32 + 1) {
    st_00->old_A[0] = *(int16_t *)(local_30 + (long)local_32 * 2);
    st_00 = (tetra_codec *)(st_00->old_A + 1);
  }
  for (local_32 = 0; local_32 < local_22; local_32 = local_32 + 1) {
    local_38 = Load_sh(st_00,(Word16)((uint)in_stack_ffffffffffffff1c >> 0x10),
                       (Word16)in_stack_ffffffffffffff1c);
    for (local_34 = 1; local_34 < 0xb; local_34 = local_34 + 1) {
      local_38 = L_msu0(st_00,in_stack_ffffffffffffff1c,in_stack_ffffffffffffff1a,
                        in_stack_ffffffffffffff18);
    }
    local_38 = add_sh(st_00,in_stack_ffffffffffffff1c,in_stack_ffffffffffffff1a,
                      in_stack_ffffffffffffff18);
    L_var1 = L_shl(st_00,in_stack_ffffffffffffff1c,in_stack_ffffffffffffff1a);
    WVar1 = extract_h(L_var1);
    st_00->old_A[0] = WVar1;
    st_00 = (tetra_codec *)(st_00->old_A + 1);
  }
  for (local_32 = 0; local_32 < local_22; local_32 = local_32 + 1) {
    *(undefined2 *)(local_20 + (long)local_32 * 2) =
         *(undefined2 *)(&stack0xffffffffffffff28 + (long)(local_32 + 10) * 2);
  }
  if ((short)yy != 0) {
    for (local_32 = 0; local_32 < 10; local_32 = local_32 + 1) {
      *(undefined2 *)(local_30 + (long)local_32 * 2) =
           *(undefined2 *)(local_20 + (long)(local_22 + -10 + (int)local_32) * 2);
    }
  }
  return;
}

Assistant:

void Syn_Filt(tetra_codec* st, Word16 a[], Word16 x[], Word16 y[], Word16 lg, Word16 mem[],
              Word16 update)
{
  Word16 i, j;
  Word32 s;
  Word16 tmp[80];	/* This is usually done by memory allocation (lg+TSC_pp) */
  Word16 *yy;

  /* Copy mem[] to yy[] */

  yy = tmp;

  for(i=0; i<TSC_pp; i++)
    *yy++ = mem[i];


  /* Do the filtering. */

  for (i = 0; i < lg; i++)
  {
    s = Load_sh(st, x[i], (Word16)12);				/* a[] is in Q12 */
    for (j = 1; j <= TSC_pp; j++)
      s = L_msu0(st, s, a[j], yy[-j]);

    s     = add_sh(st, s, (Word16)1, (Word16)11);		/* Rounding */
    *yy++ = extract_h( L_shl(st, s, (Word16)4) );
  }

  for(i=0; i<lg; i++) y[i] = tmp[i+TSC_pp];

  /* Update of memory if update==1 */

  if(update != 0)
     for (i = 0; i < TSC_pp; i++) mem[i] = y[lg-TSC_pp+i];

 return;
}